

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O3

void __thiscall write_face::operator()(write_face *this,lw_face *face,xr_writer *w)

{
  uint32_t local_1c;
  
  local_1c = (face->field_0).field_0.v[0];
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (face->field_0).field_0.ref[0];
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (face->field_0).field_0.v[1];
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (face->field_0).field_0.ref[1];
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (face->field_0).field_0.v[2];
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (face->field_0).field_0.ref[2];
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  return;
}

Assistant:

void operator()(const lw_face& face, xr_writer& w) const {
	w.w_u32(face.v0);
	w.w_u32(face.ref0);
	w.w_u32(face.v1);
	w.w_u32(face.ref1);
	w.w_u32(face.v2);
	w.w_u32(face.ref2);
}